

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

bool __thiscall
libcellml::Validator::ValidatorImpl::hasOneOrTwoMathmlChildren
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  sVar1 = mathmlChildCount(node);
  if (1 < sVar1 - 1) {
    XmlNode::name_abi_cxx11_
              (&local_40,
               (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::operator+(&local_80,"Math has a \'",&local_40);
    std::operator+(&local_60,&local_80,"\' element without exactly one or two MathML children.");
    addMathmlIssue(this,&local_60,MATH_MATHML,component);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return sVar1 - 1 < 2;
}

Assistant:

bool Validator::ValidatorImpl::hasOneOrTwoMathmlChildren(const XmlNodePtr &node,
                                                         const ComponentPtr &component)
{
    auto childCount = mathmlChildCount(node);

    if ((childCount != 1) && (childCount != 2)) {
        addMathmlIssue("Math has a '" + node->name() + "' element without exactly one or two MathML children.",
                       Issue::ReferenceRule::MATH_MATHML,
                       component);

        return false;
    }

    return true;
}